

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

curl_off_t encoder_base64_size(curl_mimepart *part)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  
  lVar2 = part->datasize;
  if (0 < lVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = lVar2 - 1;
    uVar3 = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
    lVar2 = uVar3 + (uVar3 / 0x4c) * 2 + 4;
  }
  return lVar2;
}

Assistant:

static curl_off_t encoder_base64_size(curl_mimepart *part)
{
  curl_off_t size = part->datasize;

  if(size <= 0)
    return size;    /* Unknown size or no data. */

  /* Compute base64 character count. */
  size = 4 * (1 + (size - 1) / 3);

  /* Effective character count must include CRLFs. */
  return size + 2 * ((size - 1) / MAX_ENCODED_LINE_LENGTH);
}